

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

ON_TextureMapping *
ON_TextureMapping::FromModelComponentRef
          (ON_ModelComponentReference *model_component_reference,
          ON_TextureMapping *none_return_value)

{
  bool bVar1;
  ON_TextureMapping *this;
  ON_TextureMapping *pOVar2;
  
  this = (ON_TextureMapping *)ON_ModelComponentReference::ModelComponent(model_component_reference);
  if (this == (ON_TextureMapping *)0x0) {
    pOVar2 = (ON_TextureMapping *)0x0;
  }
  else {
    bVar1 = ON_Object::IsKindOf((ON_Object *)this,&m_ON_TextureMapping_class_rtti);
    pOVar2 = (ON_TextureMapping *)0x0;
    if (bVar1) {
      pOVar2 = this;
    }
  }
  if (pOVar2 != (ON_TextureMapping *)0x0) {
    none_return_value = pOVar2;
  }
  return none_return_value;
}

Assistant:

const ON_TextureMapping* ON_TextureMapping::FromModelComponentRef(
  const class ON_ModelComponentReference& model_component_reference,
  const ON_TextureMapping* none_return_value
  )
{
  const ON_TextureMapping* p = ON_TextureMapping::Cast(model_component_reference.ModelComponent());
  return (nullptr != p) ? p : none_return_value;
}